

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

Lattice * __thiscall MeCab::anon_unknown_0::ModelImpl::createLattice(ModelImpl *this)

{
  Writer *writer;
  LatticeImpl *this_00;
  
  writer = (this->writer_).ptr_;
  if (this->viterbi_ == (Viterbi *)0x0 || writer == (Writer *)0x0) {
    setGlobalError("Model is not available");
    this_00 = (LatticeImpl *)0x0;
  }
  else {
    this_00 = (LatticeImpl *)operator_new(0xd8);
    LatticeImpl::LatticeImpl(this_00,writer);
  }
  return &this_00->super_Lattice;
}

Assistant:

Lattice *ModelImpl::createLattice() const {
  if (!is_available()) {
    setGlobalError("Model is not available");
    return 0;
  }
  return new LatticeImpl(writer_.get());
}